

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

size_t __thiscall
llvm::cl::opt<(anonymous_namespace)::VersionPrinter,_true,_llvm::cl::parser<bool>_>::getOptionWidth
          (opt<(anonymous_namespace)::VersionPrinter,_true,_llvm::cl::parser<bool>_> *this)

{
  size_t sVar1;
  
  sVar1 = basic_parser_impl::getOptionWidth((basic_parser_impl *)&this->Parser,&this->super_Option);
  return sVar1;
}

Assistant:

size_t getOptionWidth() const override {
    return Parser.getOptionWidth(*this);
  }